

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool __thiscall bssl::ssl_is_valid_alpn_list(bssl *this,Span<const_unsigned_char> in)

{
  Span<const_unsigned_char> span;
  int iVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  CBS protocol_name;
  undefined1 local_30 [8];
  CBS protocol_name_list;
  Span<const_unsigned_char> in_local;
  
  span.size_ = (size_t)in.data_;
  span.data_ = (uchar *)this;
  protocol_name.len = (size_t)this;
  protocol_name_list.len = (size_t)this;
  cbs_st::cbs_st((cbs_st *)local_30,span);
  sVar2 = CBS_len((CBS *)local_30);
  while( true ) {
    if (sVar2 == 0) {
      return false;
    }
    sVar2 = CBS_len((CBS *)local_30);
    if (sVar2 == 0) break;
    iVar1 = CBS_get_u8_length_prefixed((CBS *)local_30,(CBS *)local_50);
    if (iVar1 == 0) {
      return false;
    }
    sVar2 = CBS_len((CBS *)local_50);
  }
  return true;
}

Assistant:

bool ssl_is_valid_alpn_list(Span<const uint8_t> in) {
  CBS protocol_name_list = in;
  if (CBS_len(&protocol_name_list) == 0) {
    return false;
  }
  while (CBS_len(&protocol_name_list) > 0) {
    CBS protocol_name;
    if (!CBS_get_u8_length_prefixed(&protocol_name_list, &protocol_name) ||
        // Empty protocol names are forbidden.
        CBS_len(&protocol_name) == 0) {
      return false;
    }
  }
  return true;
}